

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

void __thiscall serial::Serial::flushInput(Serial *this)

{
  ScopedReadLock local_18;
  ScopedReadLock lock;
  Serial *this_local;
  
  lock.pimpl_ = (SerialImpl *)this;
  ScopedReadLock::ScopedReadLock(&local_18,this->pimpl_);
  SerialImpl::flushInput(this->pimpl_);
  ScopedReadLock::~ScopedReadLock(&local_18);
  return;
}

Assistant:

void Serial::flushInput ()
{
  ScopedReadLock lock(this->pimpl_);
  pimpl_->flushInput ();
}